

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeRTASBuilderDestroyExt(ze_rtas_builder_ext_handle_t hBuilder)

{
  _ze_rtas_builder_ext_handle_t *_key;
  ze_pfnRTASBuilderDestroyExt_t pfnDestroyExt;
  dditable_t *dditable;
  ze_result_t result;
  ze_rtas_builder_ext_handle_t hBuilder_local;
  
  if (*(code **)(*(long *)(hBuilder + 8) + 0x20) == (code *)0x0) {
    hBuilder_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_rtas_builder_ext_handle_t **)hBuilder;
    hBuilder_local._4_4_ = (**(code **)(*(long *)(hBuilder + 8) + 0x20))(_key);
    if (hBuilder_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_rtas_builder_ext_handle_t_*>,__ze_rtas_builder_ext_handle_t_*>
      ::release((singleton_factory_t<object_t<_ze_rtas_builder_ext_handle_t_*>,__ze_rtas_builder_ext_handle_t_*>
                 *)(context + 0x660),_key);
    }
  }
  return hBuilder_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderDestroyExt(
        ze_rtas_builder_ext_handle_t hBuilder           ///< [in][release] handle of builder object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_rtas_builder_ext_object_t*>( hBuilder )->dditable;
        auto pfnDestroyExt = dditable->ze.RTASBuilder.pfnDestroyExt;
        if( nullptr == pfnDestroyExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hBuilder = reinterpret_cast<ze_rtas_builder_ext_object_t*>( hBuilder )->handle;

        // forward to device-driver
        result = pfnDestroyExt( hBuilder );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_rtas_builder_ext_factory.release( hBuilder );

        return result;
    }